

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_type.cpp
# Opt level: O2

string * __thiscall
duckdb::CatalogTypeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,CatalogType type)

{
  int iVar1;
  char *pcVar2;
  allocator local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    pcVar2 = "Table";
    break;
  case 2:
    pcVar2 = "Schema";
    break;
  case 3:
    pcVar2 = "View";
    break;
  case 4:
    pcVar2 = "Index";
    break;
  case 5:
    pcVar2 = "Prepared Statement";
    break;
  case 6:
    pcVar2 = "Sequence";
    break;
  case 7:
    pcVar2 = "Collation";
    break;
  case 8:
    pcVar2 = "Type";
    break;
  case 9:
    pcVar2 = "Database";
    break;
  case 0x19:
    pcVar2 = "Table Function";
    break;
  case 0x1a:
    pcVar2 = "Scalar Function";
    break;
  case 0x1b:
    pcVar2 = "Aggregate Function";
    break;
  case 0x1c:
    pcVar2 = "Pragma Function";
    break;
  case 0x1d:
    pcVar2 = "Copy Function";
    break;
  case 0x1e:
    pcVar2 = "Macro Function";
    break;
  case 0x1f:
    pcVar2 = "Table Macro Function";
    break;
  default:
    if (iVar1 == 0x47) {
      pcVar2 = "Secret";
      break;
    }
    if (iVar1 == 0x48) {
      pcVar2 = "Secret Type";
      break;
    }
    if (iVar1 == 0x49) {
      pcVar2 = "Secret Function";
      break;
    }
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    pcVar2 = "INVALID";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string CatalogTypeToString(CatalogType type) {
	switch (type) {
	case CatalogType::COLLATION_ENTRY:
		return "Collation";
	case CatalogType::TYPE_ENTRY:
		return "Type";
	case CatalogType::TABLE_ENTRY:
		return "Table";
	case CatalogType::SCHEMA_ENTRY:
		return "Schema";
	case CatalogType::DATABASE_ENTRY:
		return "Database";
	case CatalogType::TABLE_FUNCTION_ENTRY:
		return "Table Function";
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		return "Scalar Function";
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
		return "Aggregate Function";
	case CatalogType::COPY_FUNCTION_ENTRY:
		return "Copy Function";
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
		return "Pragma Function";
	case CatalogType::MACRO_ENTRY:
		return "Macro Function";
	case CatalogType::TABLE_MACRO_ENTRY:
		return "Table Macro Function";
	case CatalogType::VIEW_ENTRY:
		return "View";
	case CatalogType::INDEX_ENTRY:
		return "Index";
	case CatalogType::PREPARED_STATEMENT:
		return "Prepared Statement";
	case CatalogType::SEQUENCE_ENTRY:
		return "Sequence";
	case CatalogType::SECRET_ENTRY:
		return "Secret";
	case CatalogType::SECRET_TYPE_ENTRY:
		return "Secret Type";
	case CatalogType::SECRET_FUNCTION_ENTRY:
		return "Secret Function";
	case CatalogType::INVALID:
	case CatalogType::DELETED_ENTRY:
	case CatalogType::RENAMED_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
		break;
	}
	return "INVALID";
}